

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::SingleCapPipeline::~SingleCapPipeline
          (SingleCapPipeline *this)

{
  ClientHook *pCVar1;
  Disposer *pDVar2;
  
  (this->super_PipelineHook)._vptr_PipelineHook = (_func_int **)&PTR_addRef_006fa7f8;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_006fa830;
  pCVar1 = (this->cap).ptr;
  if (pCVar1 != (ClientHook *)0x0) {
    (this->cap).ptr = (ClientHook *)0x0;
    pDVar2 = (this->cap).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pCVar1->_vptr_ClientHook + (long)pCVar1->_vptr_ClientHook[-2]));
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  operator_delete(this,0x28);
  return;
}

Assistant:

SingleCapPipeline(kj::Own<ClientHook>&& cap)
        : cap(kj::mv(cap)) {}